

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_from_array(void)

{
  undefined1 *puVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> __l;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> __l_00;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_690;
  basic_variable<std::allocator<char>_> *local_678;
  basic_variable<std::allocator<char>_> *local_658;
  basic_variable<std::allocator<char>_> *local_640;
  iterator local_628;
  iterator local_610;
  iterator local_5f8;
  iterator local_5e0;
  nullable local_5c4;
  basic_variable<std::allocator<char>_> *local_5c0;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  basic_variable<std::allocator<char>_> local_558;
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> local_4f8;
  undefined1 local_4c8 [24];
  variable expect_1;
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  basic_variable<std::allocator<char>_> local_418;
  basic_variable<std::allocator<char>_> local_3e8;
  basic_variable<std::allocator<char>_> local_3b8;
  undefined1 auStack_388 [48];
  undefined1 local_358 [8];
  variable data_1;
  iterator local_318;
  iterator local_300;
  iterator local_2e8;
  iterator local_2d0;
  nullable local_2b4;
  basic_variable<std::allocator<char>_> *local_2b0;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  undefined1 local_1b8 [24];
  variable expect;
  variable data;
  nullable local_134;
  basic_variable<std::allocator<char>_> *local_130;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  basic_variable<std::allocator<char>_> local_98;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 auStack_38 [32];
  array_type array;
  
  local_130 = &local_128;
  local_134 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_130,&local_134);
  local_130 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_130,true);
  local_130 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_130,2);
  local_130 = &local_98;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_130,3.0);
  local_130 = &local_68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_130,"alpha");
  auStack_38._8_8_ = &local_128;
  auStack_38._16_8_ = 5;
  puVar1 = &data.storage.field_0x2b;
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::allocator
            ((allocator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)puVar1);
  __l_00._M_len = auStack_38._16_8_;
  __l_00._M_array = (iterator)auStack_38._8_8_;
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)(auStack_38 + 0x18),__l_00,(allocator_type *)puVar1);
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~allocator
            ((allocator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &data.storage.field_0x2b);
  pbVar2 = &local_128;
  local_640 = (basic_variable<std::allocator<char>_> *)auStack_38;
  do {
    local_640 = local_640 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_640);
  } while (local_640 != pbVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,
             (array_type *)(auStack_38 + 0x18));
  local_2b0 = &local_2a8;
  local_2b4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2b0,&local_2b4);
  local_2b0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_2b0,true);
  local_2b0 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,2);
  local_2b0 = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_2b0,3.0);
  local_2b0 = &local_1e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2b0,"alpha");
  local_1b8._0_8_ = &local_2a8;
  local_1b8._8_8_ = 5;
  init._M_len = (size_type)pbVar2;
  init._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1b8._0_8_,init);
  local_658 = (basic_variable<std::allocator<char>_> *)local_1b8;
  do {
    local_658 = local_658 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_658);
  } while (local_658 != &local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2d0,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2e8,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1bd,"void ctor_suite::construct_from_array()",&local_2d0,&local_2e8,&local_300,
             &local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)(auStack_38 + 0x18));
  expect_1.storage._44_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_478,(nullable *)&expect_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_448,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_418,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3e8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3b8,"alpha");
  auStack_388._8_8_ = &local_478;
  auStack_388._16_8_ = 5;
  puVar1 = &expect_1.storage.field_0x2b;
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::allocator
            ((allocator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)puVar1);
  __l._M_len = auStack_388._16_8_;
  __l._M_array = (iterator)auStack_388._8_8_;
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)(auStack_388 + 0x18),__l,(allocator_type *)puVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_358,(array_type *)(auStack_388 + 0x18));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)(auStack_388 + 0x18));
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~allocator
            ((allocator<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &expect_1.storage.field_0x2b);
  pbVar2 = &local_478;
  local_678 = (basic_variable<std::allocator<char>_> *)auStack_388;
  do {
    local_678 = local_678 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_678);
  } while (local_678 != pbVar2);
  local_5c0 = &local_5b8;
  local_5c4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5c0,&local_5c4);
  local_5c0 = &local_588;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_5c0,true);
  local_5c0 = &local_558;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5c0,2);
  local_5c0 = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_5c0,3.0);
  local_5c0 = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5c0,"alpha");
  local_4c8._0_8_ = &local_5b8;
  local_4c8._8_8_ = 5;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4c8._0_8_,init_00);
  local_690 = (basic_variable<std::allocator<char>_> *)local_4c8;
  do {
    local_690 = local_690 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_690);
  } while (local_690 != &local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e0,(basic_variable<std::allocator<char>_> *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5f8,(basic_variable<std::allocator<char>_> *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_610,(basic_variable<std::allocator<char>_> *)(local_4c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_628,(basic_variable<std::allocator<char>_> *)(local_4c8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1c6,"void ctor_suite::construct_from_array()",&local_5e0,&local_5f8,&local_610,
             &local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_610);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_358);
  return;
}

Assistant:

void construct_from_array()
{
    // lvalue
    {
        variable::array_type array = { null, true, 2, 3.0, "alpha" };
        variable data = array;

        variable expect = array::make({ null, true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    // rvalue
    {
        variable data = variable::array_type{ null, true, 2, 3.0, "alpha" };

        variable expect = array::make({ null, true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}